

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_fill_random
              (mbedtls_mpi *X,size_t size,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_resize_clear(X,((size >> 3) + 1) - (ulong)((size & 7) == 0));
  if (iVar1 == 0) {
    if (size != 0) {
      iVar1 = mbedtls_mpi_core_fill_random(X->p,(ulong)X->n,size,f_rng,p_rng);
      return iVar1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_fill_random(mbedtls_mpi *X, size_t size,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(size);

    /* Ensure that target MPI has exactly the necessary number of limbs */
    MBEDTLS_MPI_CHK(mbedtls_mpi_resize_clear(X, limbs));
    if (size == 0) {
        return 0;
    }

    ret = mbedtls_mpi_core_fill_random(X->p, X->n, size, f_rng, p_rng);

cleanup:
    return ret;
}